

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_userdata.cpp
# Opt level: O0

void __thiscall ON_UserData::ON_UserData(ON_UserData *this,ON_UserData *src)

{
  unsigned_short uVar1;
  unsigned_short uVar2;
  ON_UserData *src_local;
  ON_UserData *this_local;
  
  ON_Object::ON_Object(&this->super_ON_Object,&src->super_ON_Object);
  (this->super_ON_Object)._vptr_ON_Object = (_func_int **)&PTR_ClassId_00b7ac60;
  uVar1 = (src->m_userdata_uuid).Data2;
  uVar2 = (src->m_userdata_uuid).Data3;
  (this->m_userdata_uuid).Data1 = (src->m_userdata_uuid).Data1;
  (this->m_userdata_uuid).Data2 = uVar1;
  (this->m_userdata_uuid).Data3 = uVar2;
  *(undefined8 *)(this->m_userdata_uuid).Data4 = *(undefined8 *)(src->m_userdata_uuid).Data4;
  uVar1 = (src->m_application_uuid).Data2;
  uVar2 = (src->m_application_uuid).Data3;
  (this->m_application_uuid).Data1 = (src->m_application_uuid).Data1;
  (this->m_application_uuid).Data2 = uVar1;
  (this->m_application_uuid).Data3 = uVar2;
  *(undefined8 *)(this->m_application_uuid).Data4 = *(undefined8 *)(src->m_application_uuid).Data4;
  this->m_userdata_copycount = src->m_userdata_copycount;
  memcpy(&this->m_userdata_xform,&src->m_userdata_xform,0x80);
  this->m_userdata_owner = (ON_Object *)0x0;
  this->m_userdata_next = (ON_UserData *)0x0;
  if ((this->m_userdata_copycount != 0) &&
     (this->m_userdata_copycount = this->m_userdata_copycount + 1, this->m_userdata_copycount == 0))
  {
    this->m_userdata_copycount = 1;
  }
  return;
}

Assistant:

ON_UserData::ON_UserData(const ON_UserData& src) 
            : ON_Object(src),
              m_userdata_uuid(src.m_userdata_uuid), 
              m_application_uuid(src.m_application_uuid),
              m_userdata_copycount(src.m_userdata_copycount),
              m_userdata_xform(src.m_userdata_xform),
              m_userdata_owner(0), // do not copy owner
              m_userdata_next(0)   // do not copy next
{
  if ( m_userdata_copycount) 
  {
    m_userdata_copycount++;
    if ( !m_userdata_copycount )
      m_userdata_copycount = 1;
  }
}